

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

int __thiscall QTabBarPrivate::indexAtPos(QTabBarPrivate *this,QPoint *p)

{
  QTabBar *this_00;
  char cVar1;
  int i;
  int index;
  ulong uVar2;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBar **)&(this->super_QWidgetPrivate).field_0x8;
  local_48 = QTabBar::tabRect(this_00,this->currentIndex);
  cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
  if (cVar1 == '\0') {
    for (uVar2 = 0; index = -1, uVar2 < (ulong)(this->tabList).d.size; uVar2 = uVar2 + 1) {
      if (((this->tabList).d.ptr[uVar2]->field_0xe4 & 1) != 0) {
        index = (int)uVar2;
        local_48 = QTabBar::tabRect(this_00,index);
        cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
        if (cVar1 != '\0') break;
      }
    }
  }
  else {
    index = this->currentIndex;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return index;
}

Assistant:

int QTabBarPrivate::indexAtPos(const QPoint &p) const
{
    Q_Q(const QTabBar);
    if (q->tabRect(currentIndex).contains(p))
        return currentIndex;
    for (int i = 0; i < tabList.size(); ++i)
        if (tabList.at(i)->enabled && q->tabRect(i).contains(p))
            return i;
    return -1;
}